

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O3

void KDict_MergeData(KonohaContext *kctx,KDict *dict,KKeyValue *kvs,size_t nitems,int isOverride)

{
  ksymbol_t kVar1;
  _func_KKeyValue_ptr_KonohaContext_ptr_KDict_ptr_ksymbol_t *p_Var2;
  _func_void_KonohaContext_ptr_KDict_ptr_KKeyValue_ptr *p_Var3;
  long lVar4;
  ktypeattr_t kVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  KDict *pKVar8;
  KKeyValue *pKVar9;
  size_t sVar10;
  size_t sVar11;
  KKeyValue *pKVar12;
  void *__s;
  undefined8 uStack_50;
  KDict *local_48;
  int local_3c;
  size_t local_38;
  
  local_3c = isOverride;
  if ((dict->data).bytesize < 0x10) {
    uStack_50 = 0x1052e2;
    KDict_Ensure(kctx,dict,nitems);
    uStack_50 = 0x1052f8;
    memcpy((dict->data).field_1.bytebuf,kvs,nitems << 4);
    (dict->data).bytesize = nitems << 4;
    uStack_50 = 0x105325;
    (*kctx->platApi->qsort_i)
              ((dict->data).field_1.bytebuf,nitems & 0xfffffffffffffff,0x10,comprKeyVal);
    dict->sortedData = nitems & 0xfffffffffffffff;
  }
  else {
    lVar4 = -(nitems + 0xf & 0xfffffffffffffff0);
    __s = (void *)((long)&local_48 + lVar4);
    local_38 = nitems;
    *(undefined8 *)((long)&uStack_50 + lVar4) = 0x105350;
    memset(__s,0,nitems);
    if (local_38 != 0) {
      sVar10 = 0;
      pKVar12 = kvs;
      local_48 = dict;
      do {
        pKVar8 = local_48;
        kVar1 = pKVar12->key;
        p_Var2 = kctx->klib->KDict_GetNULL;
        *(undefined8 *)((long)&uStack_50 + lVar4) = 0x105372;
        pKVar9 = (*p_Var2)(kctx,pKVar8,kVar1);
        if ((pKVar9 != (KKeyValue *)0x0) && (*(undefined1 *)((long)__s + sVar10) = 1, local_3c != 0)
           ) {
          kVar5 = pKVar12->typeAttr;
          uVar6 = *(undefined4 *)&pKVar12->field_2;
          uVar7 = *(undefined4 *)((long)&pKVar12->field_2 + 4);
          pKVar9->key = pKVar12->key;
          pKVar9->typeAttr = kVar5;
          *(undefined4 *)&pKVar9->field_2 = uVar6;
          *(undefined4 *)((long)&pKVar9->field_2 + 4) = uVar7;
        }
        pKVar8 = local_48;
        sVar10 = sVar10 + 1;
        pKVar12 = pKVar12 + 1;
      } while (local_38 != sVar10);
      sVar11 = 0;
      sVar10 = local_38;
      do {
        if (*(char *)((long)__s + sVar11) == '\0') {
          p_Var3 = kctx->klib->KDict_Add;
          *(undefined8 *)((long)&uStack_50 + lVar4) = 0x1053bc;
          (*p_Var3)(kctx,pKVar8,kvs);
          sVar10 = local_38;
        }
        sVar11 = sVar11 + 1;
        kvs = kvs + 1;
      } while (sVar10 != sVar11);
    }
  }
  return;
}

Assistant:

KLIBDECL void KDict_MergeData(KonohaContext *kctx, KDict *dict, KKeyValue *kvs, size_t nitems, int isOverride)
{
	size_t i;
	kbool_t *foundItems;
	if(KDict_size(dict) == 0) {
		KDict_Ensure(kctx, dict, nitems);
		memcpy(dict->data.keyValueItems, kvs, nitems * sizeof(KKeyValue));
		dict->data.bytesize = nitems * sizeof(KKeyValue);
		KDict_Sort(kctx, dict);
		return;
	}
	foundItems = ALLOCA(kbool_t, nitems);
	bzero(foundItems, sizeof(kbool_t) * nitems);
	for(i = 0; i < nitems; i++) {
		KKeyValue *stored = KLIB KDict_GetNULL(kctx, dict, kvs[i].key);
		if(stored != NULL) {
			foundItems[i] = true;
			if(isOverride) {
				stored[0] = kvs[i];
			}
		}
	}
	for(i = 0; i < nitems; i++) {
		if(!foundItems[i]) {
			KLIB KDict_Add(kctx, dict, kvs + i);
		}
	}
}